

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferVkImpl.hpp
# Opt level: O0

void * __thiscall Diligent::BufferVkImpl::GetCPUAddress(BufferVkImpl *this)

{
  Char *Message;
  void *pvVar1;
  char (*in_RCX) [63];
  undefined1 local_30 [8];
  string msg;
  BufferVkImpl *this_local;
  
  msg.field_2._8_8_ = this;
  if (((this->super_BufferBase<Diligent::EngineVkImplTraits>).
       super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
       .m_Desc.Usage != USAGE_STAGING) &&
     ((this->super_BufferBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
      .m_Desc.Usage != USAGE_UNIFIED)) {
    FormatString<char[26],char[63]>
              ((string *)local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_Desc.Usage == USAGE_STAGING || m_Desc.Usage == USAGE_UNIFIED",
               in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetCPUAddress",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/BufferVkImpl.hpp"
               ,100);
    std::__cxx11::string::~string((string *)local_30);
  }
  pvVar1 = VulkanUtilities::VulkanMemoryPage::GetCPUMemory((this->m_MemoryAllocation).Page);
  return (void *)((long)pvVar1 + this->m_BufferMemoryAlignedOffset);
}

Assistant:

void* GetCPUAddress()
    {
        VERIFY_EXPR(m_Desc.Usage == USAGE_STAGING || m_Desc.Usage == USAGE_UNIFIED);
        return reinterpret_cast<Uint8*>(m_MemoryAllocation.Page->GetCPUMemory()) + m_BufferMemoryAlignedOffset;
    }